

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate_suite.cpp
# Opt level: O0

void accumulate_array_array(void)

{
  size_type in_RCX;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_430;
  basic_variable<std::allocator<char>_> *local_418;
  basic_variable<std::allocator<char>_> *local_400;
  basic_variable<std::allocator<char>_> *local_3e8;
  iterator local_3d0;
  iterator local_3b8;
  iterator local_3a0;
  iterator local_388;
  basic_variable<std::allocator<char>_> *local_370;
  basic_variable<std::allocator<char>_> local_368;
  basic_variable<std::allocator<char>_> local_338;
  basic_variable<std::allocator<char>_> local_308;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_2a8 [24];
  variable expect;
  undefined1 local_25b;
  undefined1 local_25a [2];
  basic_variable<std::allocator<char>_> local_258;
  iterator local_228;
  iterator local_210;
  undefined1 local_1f8 [8];
  variable result;
  basic_variable<std::allocator<char>_> local_1b8;
  basic_variable<std::allocator<char>_> local_188;
  undefined1 auStack_158 [48];
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 auStack_c8 [80];
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  result.storage._47_1_ = 1;
  auStack_c8._24_8_ = auStack_c8 + 0x20;
  auStack_158._40_8_ = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_158._40_8_,"alpha");
  auStack_158._40_8_ = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_158._40_8_,"bravo");
  auStack_c8._8_8_ = &local_128;
  auStack_c8._16_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(auStack_c8 + 0x20),
             (basic_array<std::allocator<char>_> *)auStack_c8._8_8_,init);
  auStack_c8._24_8_ = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1b8,"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_188,"delta");
  auStack_158._8_8_ = &local_1b8;
  auStack_158._16_8_ = 2;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&local_78,(basic_array<std::allocator<char>_> *)auStack_158._8_8_,init_00);
  result.storage._47_1_ = 0;
  local_48._0_8_ = auStack_c8 + 0x20;
  local_48._8_8_ = 2;
  init_01._M_len = in_RCX;
  init_01._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init_01);
  local_3e8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_3e8 = local_3e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3e8);
  } while (local_3e8 != (basic_variable<std::allocator<char>_> *)(auStack_c8 + 0x20));
  local_400 = (basic_variable<std::allocator<char>_> *)auStack_158;
  do {
    local_400 = local_400 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_400);
  } while (local_400 != &local_1b8);
  local_418 = (basic_variable<std::allocator<char>_> *)auStack_c8;
  do {
    local_418 = local_418 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_418);
  } while (local_418 != &local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_210,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_228,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258);
  std::
  accumulate<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            ((basic_variable<std::allocator<char>_> *)local_1f8,&local_210,&local_228,&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  local_25a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_1f8);
  local_25b = 1;
  sVar1 = 0xb8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0xb8,"void accumulate_array_array()",local_25a,&local_25b);
  local_370 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_370,"alpha");
  local_370 = &local_338;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_370,"bravo");
  local_370 = &local_308;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_370,"charlie");
  local_370 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_370,"delta");
  local_2a8._0_8_ = &local_368;
  local_2a8._8_8_ = 4;
  init_02._M_len = sVar1;
  init_02._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2a8._0_8_,init_02);
  local_430 = (basic_variable<std::allocator<char>_> *)local_2a8;
  do {
    local_430 = local_430 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_430);
  } while (local_430 != &local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_388,(basic_variable<std::allocator<char>_> *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3a0,(basic_variable<std::allocator<char>_> *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3b8,(basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3d0,(basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0xbc,"void accumulate_array_array()",&local_388,&local_3a0,&local_3b8,&local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void accumulate_array_array()
{
    // Array flattening
    variable data = array::make({ array::make({ "alpha", "bravo" }), array::make({ "charlie", "delta" }) });
    variable result = std::accumulate(data.begin(), data.end(), variable());
    TRIAL_PROTOCOL_TEST_EQUAL(result.is<array>(), true);
    variable expect = array::make({ "alpha", "bravo", "charlie", "delta" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}